

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_parse_tests.cpp
# Opt level: O0

void __thiscall script_parse_tests::parse_script::test_method(parse_script *this)

{
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar1;
  type *ptVar2;
  long in_FS_OFFSET;
  runtime_error *ex_2;
  runtime_error *ex_1;
  runtime_error *ex;
  type *out;
  type *in;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  IN_OUT;
  string all_out;
  string all_in;
  char *in_stack_fffffffffffff178;
  type *in_stack_fffffffffffff180;
  char *in_stack_fffffffffffff188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff190;
  const_string *in_stack_fffffffffffff1a0;
  size_t in_stack_fffffffffffff1a8;
  const_string *in_stack_fffffffffffff1b0;
  allocator<char> *in_stack_fffffffffffff1b8;
  undefined7 in_stack_fffffffffffff1c0;
  undefined1 in_stack_fffffffffffff1c7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff1c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff1d0;
  Span<const_unsigned_char> in_stack_fffffffffffff200;
  string *in_stack_fffffffffffff2d8;
  long *local_d10;
  const_string local_c08;
  lazy_ostream local_bf8 [2];
  assertion_result local_bd8 [2];
  allocator<char> local_b99 [145];
  const_string local_b08;
  lazy_ostream local_af8 [2];
  assertion_result local_ad8 [2];
  allocator<char> local_a99 [145];
  const_string local_a08;
  lazy_ostream local_9f8 [2];
  assertion_result local_9d8 [2];
  allocator<char> local_999 [49];
  undefined1 local_968 [16];
  undefined1 local_958 [80];
  undefined1 local_908 [16];
  undefined1 local_8f8 [64];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_8b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_8b0;
  undefined1 local_6e8 [128];
  undefined1 local_668 [32];
  type local_648 [2];
  long local_608 [192];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[1],_const_char_(&)[1],_true>
            (in_stack_fffffffffffff1d0,(char (*) [1])in_stack_fffffffffffff1c8,
             (char (*) [1])CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff1d0,(char (*) [2])in_stack_fffffffffffff1c8,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff1d0,(char (*) [2])in_stack_fffffffffffff1c8,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff1d0,(char (*) [2])in_stack_fffffffffffff1c8,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff1d0,(char (*) [2])in_stack_fffffffffffff1c8,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff1d0,(char (*) [2])in_stack_fffffffffffff1c8,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff1d0,(char (*) [2])in_stack_fffffffffffff1c8,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff1d0,(char (*) [2])in_stack_fffffffffffff1c8,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff1d0,(char (*) [2])in_stack_fffffffffffff1c8,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff1d0,(char (*) [2])in_stack_fffffffffffff1c8,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff1d0,(char (*) [2])in_stack_fffffffffffff1c8,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff1d0,(char (*) [3])in_stack_fffffffffffff1c8,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff1d0,(char (*) [3])in_stack_fffffffffffff1c8,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff1d0,(char (*) [3])in_stack_fffffffffffff1c8,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff1d0,(char (*) [3])in_stack_fffffffffffff1c8,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff1d0,(char (*) [3])in_stack_fffffffffffff1c8,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff1d0,(char (*) [3])in_stack_fffffffffffff1c8,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff1d0,(char (*) [3])in_stack_fffffffffffff1c8,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[5],_true>
            (in_stack_fffffffffffff1d0,(char (*) [3])in_stack_fffffffffffff1c8,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[5],_true>
            (in_stack_fffffffffffff1d0,(char (*) [3])in_stack_fffffffffffff1c8,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff1d0,(char (*) [5])in_stack_fffffffffffff1c8,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[7],_true>
            (in_stack_fffffffffffff1d0,(char (*) [5])in_stack_fffffffffffff1c8,
             (char (*) [7])CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff1d0,(char (*) [5])in_stack_fffffffffffff1c8,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff1d0,(char (*) [6])in_stack_fffffffffffff1c8,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff178);
  __l._M_array._7_1_ = in_stack_fffffffffffff1c7;
  __l._M_array._0_7_ = in_stack_fffffffffffff1c0;
  __l._M_len = (size_type)in_stack_fffffffffffff1c8;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)in_stack_fffffffffffff1b8,__l,(allocator_type *)in_stack_fffffffffffff1b0);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff178);
  local_d10 = &local_8;
  do {
    local_d10 = local_d10 + -8;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffff178);
  } while (local_d10 != local_608);
  std::__cxx11::string::string(in_stack_fffffffffffff190);
  std::__cxx11::string::string(in_stack_fffffffffffff190);
  local_8b0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff180);
  local_8b8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff180);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)in_stack_fffffffffffff188,
                            (__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)in_stack_fffffffffffff180), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator*((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)in_stack_fffffffffffff178);
    std::get<0ul,std::__cxx11::string,std::__cxx11::string>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff178);
    ptVar2 = std::get<1ul,std::__cxx11::string,std::__cxx11::string>
                       ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_fffffffffffff178);
    do {
      in_stack_fffffffffffff2d8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
                 (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff178);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
                 in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff180,(char (*) [1])in_stack_fffffffffffff178);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
                 (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
      ParseScript(in_stack_fffffffffffff2d8);
      Span<const_unsigned_char>::Span<CScript>
                ((Span<const_unsigned_char> *)in_stack_fffffffffffff188,
                 (CScript *)in_stack_fffffffffffff180,in_stack_fffffffffffff178);
      HexStr_abi_cxx11_(in_stack_fffffffffffff200);
      in_stack_fffffffffffff188 = "out";
      in_stack_fffffffffffff178 = "HexStr(ParseScript(in))";
      in_stack_fffffffffffff180 = ptVar2;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                (local_8f8,local_908,0x2d,1,2,local_668);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff178);
      CScript::~CScript((CScript *)in_stack_fffffffffffff178);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff178);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::operator+((char *)in_stack_fffffffffffff1c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0));
    std::operator+(in_stack_fffffffffffff190,in_stack_fffffffffffff188);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff188,in_stack_fffffffffffff180);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff178);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff178);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff188,in_stack_fffffffffffff180);
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffff178);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
               (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff178);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
               in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff180,(char (*) [1])in_stack_fffffffffffff178);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
               (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
    ParseScript(in_stack_fffffffffffff2d8);
    Span<const_unsigned_char>::Span<CScript>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffff188,
               (CScript *)in_stack_fffffffffffff180,in_stack_fffffffffffff178);
    HexStr_abi_cxx11_(in_stack_fffffffffffff200);
    in_stack_fffffffffffff188 = "all_out";
    in_stack_fffffffffffff180 = local_648;
    in_stack_fffffffffffff178 = "HexStr(ParseScript(all_in))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_958,local_968,0x31,1,2,local_6e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff178);
    CScript::~CScript((CScript *)in_stack_fffffffffffff178);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff178);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
               (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff178);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
               in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff1c8,
               (char *)CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0),
               in_stack_fffffffffffff1b8);
    ParseScript(in_stack_fffffffffffff2d8);
    CScript::~CScript((CScript *)in_stack_fffffffffffff178);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff178);
    std::allocator<char>::~allocator(local_999);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
                 (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff178);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
                 in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff188,
                 SUB81((ulong)in_stack_fffffffffffff180 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff180,(char (*) [53])in_stack_fffffffffffff178)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
                 (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
      in_stack_fffffffffffff178 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_9d8,local_9f8,&local_a08,0x33,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_fffffffffffff178);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff178);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
               (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff178);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
               in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff1c8,
               (char *)CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0),
               in_stack_fffffffffffff1b8);
    ParseScript(in_stack_fffffffffffff2d8);
    CScript::~CScript((CScript *)in_stack_fffffffffffff178);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff178);
    std::allocator<char>::~allocator(local_a99);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
                 (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff178);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
                 in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff188,
                 SUB81((ulong)in_stack_fffffffffffff180 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff180,(char (*) [53])in_stack_fffffffffffff178)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
                 (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
      in_stack_fffffffffffff178 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_ad8,local_af8,&local_b08,0x34,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_fffffffffffff178);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff178);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
               (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff178);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
               in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff1c8,
               (char *)CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0),
               in_stack_fffffffffffff1b8);
    ParseScript(in_stack_fffffffffffff2d8);
    CScript::~CScript((CScript *)in_stack_fffffffffffff178);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff178);
    std::allocator<char>::~allocator(local_b99);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
                 (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff178);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
                 in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff188,
                 SUB81((ulong)in_stack_fffffffffffff180 >> 0x38,0));
      in_stack_fffffffffffff1c8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff180,(char (*) [53])in_stack_fffffffffffff178)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
                 (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
      in_stack_fffffffffffff178 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_bd8,local_bf8,&local_c08,0x35,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_fffffffffffff178);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff178);
      in_stack_fffffffffffff1c7 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffff1c7);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff178);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff178);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)in_stack_fffffffffffff188);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(parse_script)
{
    const std::vector<std::pair<std::string,std::string>> IN_OUT{
        // {IN: script string , OUT: hex string }
        {"", ""},
        {"0", "00"},
        {"1", "51"},
        {"2", "52"},
        {"3", "53"},
        {"4", "54"},
        {"5", "55"},
        {"6", "56"},
        {"7", "57"},
        {"8", "58"},
        {"9", "59"},
        {"10", "5a"},
        {"11", "5b"},
        {"12", "5c"},
        {"13", "5d"},
        {"14", "5e"},
        {"15", "5f"},
        {"16", "60"},
        {"17", "0111"},
        {"-9", "0189"},
        {"0x17", "17"},
        {"'17'", "023137"},
        {"ELSE", "67"},
        {"NOP10", "b9"},
    };
    std::string all_in;
    std::string all_out;
    for (const auto& [in, out] : IN_OUT) {
        BOOST_CHECK_EQUAL(HexStr(ParseScript(in)), out);
        all_in += " " + in + " ";
        all_out += out;
    }
    BOOST_CHECK_EQUAL(HexStr(ParseScript(all_in)), all_out);

    BOOST_CHECK_EXCEPTION(ParseScript("11111111111111111111"), std::runtime_error, HasReason("script parse error: decimal numeric value only allowed in the range -0xFFFFFFFF...0xFFFFFFFF"));
    BOOST_CHECK_EXCEPTION(ParseScript("11111111111"), std::runtime_error, HasReason("script parse error: decimal numeric value only allowed in the range -0xFFFFFFFF...0xFFFFFFFF"));
    BOOST_CHECK_EXCEPTION(ParseScript("OP_CHECKSIGADD"), std::runtime_error, HasReason("script parse error: unknown opcode"));
}